

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.hh
# Opt level: O2

void __thiscall
hgdb::json::Scope<hgdb::json::VarStmt>::serialize(Scope<hgdb::json::VarStmt> *this,JSONWriter *w)

{
  pointer puVar1;
  ScopeBase *pSVar2;
  int iVar3;
  JSONWriter *pJVar4;
  undefined4 extraout_var;
  char *extraout_RDX;
  unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_> *scope;
  pointer puVar5;
  string_view name;
  basic_string_view<char,_std::char_traits<char>_> value;
  string_view name_00;
  string_view name_01;
  string_view name_02;
  string_view name_03;
  string_view name_04;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pJVar4 = JSONWriter::begin_obj(w);
  name._M_str = "type";
  name._M_len = 4;
  pJVar4 = JSONWriter::key(pJVar4,name);
  iVar3 = (*(this->super_ScopeBase)._vptr_ScopeBase[3])(this);
  value._M_len._4_4_ = extraout_var;
  value._M_len._0_4_ = iVar3;
  value._M_str = extraout_RDX;
  JSONWriter::value<std::basic_string_view<char,std::char_traits<char>>>(pJVar4,value);
  if ((this->filename)._M_string_length != 0) {
    name_00._M_str = "filename";
    name_00._M_len = 8;
    pJVar4 = JSONWriter::key(w,name_00);
    std::__cxx11::string::string((string *)&local_70,(string *)&this->filename);
    JSONWriter::value<std::__cxx11::string>(pJVar4,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
  }
  if ((this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
      super__Optional_payload_base<unsigned_int>._M_engaged == true) {
    name_01._M_str = "line";
    name_01._M_len = 4;
    pJVar4 = JSONWriter::key(w,name_01);
    JSONWriter::value<unsigned_int>
              (pJVar4,(this->line_num).super__Optional_base<unsigned_int,_true,_true>._M_payload.
                      super__Optional_payload_base<unsigned_int>._M_payload._M_value);
    if (this->column_num != 0) {
      name_02._M_str = "column";
      name_02._M_len = 6;
      pJVar4 = JSONWriter::key(w,name_02);
      JSONWriter::value<unsigned_int>(pJVar4,this->column_num);
    }
  }
  if ((this->condition)._M_string_length != 0) {
    name_03._M_str = "condition";
    name_03._M_len = 9;
    pJVar4 = JSONWriter::key(w,name_03);
    std::__cxx11::string::string((string *)&local_50,(string *)&this->condition);
    JSONWriter::value<std::__cxx11::string>(pJVar4,&local_50);
    std::__cxx11::string::~string((string *)&local_50);
  }
  if ((this->super_ScopeBase).scopes_.
      super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->super_ScopeBase).scopes_.
      super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    name_04._M_str = "scope";
    name_04._M_len = 5;
    pJVar4 = JSONWriter::key(w,name_04);
    JSONWriter::begin_array(pJVar4);
    puVar1 = (this->super_ScopeBase).scopes_.
             super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (puVar5 = (this->super_ScopeBase).scopes_.
                  super__Vector_base<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>,_std::allocator<std::unique_ptr<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_start; puVar5 != puVar1; puVar5 = puVar5 + 1)
    {
      pSVar2 = (puVar5->_M_t).
               super___uniq_ptr_impl<hgdb::json::ScopeBase,_std::default_delete<hgdb::json::ScopeBase>_>
               ._M_t.
               super__Tuple_impl<0UL,_hgdb::json::ScopeBase_*,_std::default_delete<hgdb::json::ScopeBase>_>
               .super__Head_base<0UL,_hgdb::json::ScopeBase_*,_false>._M_head_impl;
      (**pSVar2->_vptr_ScopeBase)(pSVar2,w);
    }
    JSONWriter::end_array(w);
  }
  (*(this->super_ScopeBase)._vptr_ScopeBase[5])(this,w);
  JSONWriter::end_obj(w);
  return;
}

Assistant:

void serialize(JSONWriter &w) const override {
        w.begin_obj().key("type").value(type());
        if (!filename.empty()) {
            w.key("filename").value(filename);
        }
        if (line_num) {
            w.key("line").value(*line_num);
            if (column_num != 0) {
                w.key("column").value(column_num);
            }
        }
        if (!condition.empty()) {
            w.key("condition").value(condition);
        }

        bool has_scope = !scopes_.empty();
        if constexpr (std::is_same_v<C, Module>) {
            has_scope = true;
        }

        if (has_scope) {
            w.key("scope").begin_array();
            for (auto const &scope : scopes_) {
                scope->serialize(w);
            }
            w.end_array();
        }

        serialize_(w);

        w.end_obj();
    }